

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<ReplaceExtraCompilerCacheKey,_QString>_>::freeData
          (Span<QHashPrivate::Node<ReplaceExtraCompilerCacheKey,_QString>_> *this)

{
  byte bVar1;
  void *pvVar2;
  QString *pQVar3;
  Node<ReplaceExtraCompilerCacheKey,_QString> *in_RDI;
  uchar o;
  uchar *__end4;
  uchar *__begin4;
  uchar (*__range4) [128];
  Node<ReplaceExtraCompilerCacheKey,_QString> *local_18;
  
  if ((in_RDI->value).d.size != 0) {
    pQVar3 = &in_RDI->value;
    for (local_18 = in_RDI;
        local_18 != (Node<ReplaceExtraCompilerCacheKey,_QString> *)&(pQVar3->d).size;
        local_18 = (Node<ReplaceExtraCompilerCacheKey,_QString> *)((long)&(local_18->key).hash + 1))
    {
      bVar1 = (byte)(local_18->key).hash;
      if (bVar1 != 0xff) {
        Entry::node((Entry *)((in_RDI->value).d.size + (ulong)bVar1 * 0x88));
        Node<ReplaceExtraCompilerCacheKey,_QString>::~Node(in_RDI);
      }
    }
    pvVar2 = (void *)(in_RDI->value).d.size;
    if (pvVar2 != (void *)0x0) {
      operator_delete__(pvVar2);
    }
    (in_RDI->value).d.size = 0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }